

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

uint __thiscall
RigidBodyDynamics::ConstraintSet::AddLoopConstraint
          (ConstraintSet *this,uint idPredecessor,uint idSuccessor,SpatialTransform *XPredecessor,
          SpatialTransform *XSuccessor,SpatialVector *constraintAxisInPredecessor,
          bool enableBaumgarteStabilization,double stabilizationTimeConstant,char *constraintName,
          uint userDefinedId)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  size_type sVar4;
  element_type *peVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  const_reference pvVar7;
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  *pvVar8;
  ulong uVar9;
  Index IVar10;
  Scalar *pSVar11;
  Index IVar12;
  Scalar *pSVar13;
  Scalar *pSVar14;
  long lVar15;
  ostream *poVar16;
  undefined8 uVar17;
  value_type in_EDX;
  value_type in_ESI;
  long in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_unsigned_int>_>::value,_pair<iterator,_bool>_>
  _Var18;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_unsigned_int>_>::value,_pair<iterator,_bool>_>
  _Var19;
  byte in_stack_00000008;
  LoopConstraint *in_stack_00000010;
  uint in_stack_00000018;
  stringstream errormsg;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> iter;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> iter_2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  iter_1;
  string nameStr;
  LoopConstraint loopCon;
  uint j;
  uint i;
  SpatialTransform frameErrorSuc;
  SpatialTransform frameErrorPre;
  bool framesNumericallyIdentical;
  uint idx;
  bool constraintAppended;
  double tol;
  uint rowsInG;
  uint insertAtRowInG;
  uint in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff92c;
  LoopConstraint *in_stack_fffffffffffff930;
  uint in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff93c;
  undefined4 in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff944;
  undefined4 in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff94c;
  SpatialTransform *in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff95c;
  undefined1 in_stack_fffffffffffff9ae;
  undefined1 in_stack_fffffffffffff9af;
  double in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9b8;
  undefined1 enableBaumgarteStabilization_00;
  SpatialVector *in_stack_fffffffffffff9c0;
  SpatialTransform *in_stack_fffffffffffff9c8;
  SpatialTransform *in_stack_fffffffffffff9d0;
  undefined8 in_stack_fffffffffffff9d8;
  LoopConstraint *in_stack_fffffffffffff9e0;
  char *in_stack_fffffffffffff9f8;
  undefined8 in_stack_fffffffffffffa00;
  stringstream local_578 [16];
  ostream local_568 [376];
  _Base_ptr local_3f0;
  undefined1 local_3e8;
  uint local_3e0;
  uint local_3dc;
  pair<unsigned_int,_unsigned_int> local_3d8;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> local_3d0;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> local_3c0;
  _Base_ptr local_3b0;
  undefined1 local_3a8;
  uint local_39c;
  pair<unsigned_int,_unsigned_int> local_398;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> local_390;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> local_380;
  _Base_ptr local_370;
  undefined1 local_368;
  int local_35c;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  local_330;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  local_320 [5];
  string local_2c8 [32];
  undefined4 local_2a8;
  uint local_180;
  uint local_17c;
  byte local_51;
  uint local_50;
  byte local_49;
  double local_48;
  int local_40;
  uint local_3c;
  byte local_29;
  value_type local_10;
  value_type local_c;
  
  local_29 = in_stack_00000008 & 1;
  local_10 = in_EDX;
  local_c = in_ESI;
  sVar3 = size((ConstraintSet *)0x6d8362);
  local_3c = (uint)sVar3;
  local_40 = local_3c + 1;
  local_48 = std::numeric_limits<double>::epsilon();
  local_48 = local_48 * 100.0;
  local_49 = 0;
  sVar4 = std::
          vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
          ::size((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
                  *)(in_RDI + 0xf8));
  local_50 = (uint)sVar4;
  sVar4 = std::
          vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
          ::size((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
                  *)(in_RDI + 0xf8));
  enableBaumgarteStabilization_00 = (undefined1)((ulong)in_stack_fffffffffffff9b8 >> 0x38);
  uVar2 = (uint)in_stack_fffffffffffffa00;
  if (sVar4 != 0) {
    local_50 = local_50 - 1;
    std::
    vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
    ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
                  *)(in_RDI + 0xf8),(ulong)local_50);
    peVar5 = std::
             __shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x6d840b);
    pvVar6 = Constraint::getBodyIds(&peVar5->super_Constraint);
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar6,0);
    enableBaumgarteStabilization_00 = (undefined1)((ulong)in_stack_fffffffffffff9b8 >> 0x38);
    uVar2 = (uint)in_stack_fffffffffffffa00;
    if (*pvVar7 == local_c) {
      std::
      vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
      ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
                    *)(in_RDI + 0xf8),(ulong)local_50);
      peVar5 = std::
               __shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x6d8453);
      pvVar6 = Constraint::getBodyIds(&peVar5->super_Constraint);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar6,1);
      enableBaumgarteStabilization_00 = (undefined1)((ulong)in_stack_fffffffffffff9b8 >> 0x38);
      uVar2 = (uint)in_stack_fffffffffffffa00;
      if (*pvVar7 == local_10) {
        local_51 = 1;
        Math::SpatialTransform::SpatialTransform(in_stack_fffffffffffff950);
        Math::SpatialTransform::SpatialTransform(in_stack_fffffffffffff950);
        std::
        vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
        ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
                      *)(in_RDI + 0xf8),(ulong)local_50);
        peVar5 = std::
                 __shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x6d84d2);
        pvVar8 = &Constraint::getBodyFrames(&peVar5->super_Constraint)->
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ;
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[](pvVar8,0);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                  ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff950);
        Vector3_t::operator=
                  ((Vector3_t *)in_stack_fffffffffffff930,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        std::
        vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
        ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
                      *)(in_RDI + 0xf8),(ulong)local_50);
        peVar5 = std::
                 __shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x6d8550);
        pvVar8 = &Constraint::getBodyFrames(&peVar5->super_Constraint)->
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ;
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[](pvVar8,0);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator-
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                   CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                   (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff950);
        Matrix3_t::operator=
                  ((Matrix3_t *)in_stack_fffffffffffff930,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        std::
        vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
        ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
                      *)(in_RDI + 0xf8),(ulong)local_50);
        peVar5 = std::
                 __shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x6d85ca);
        pvVar8 = &Constraint::getBodyFrames(&peVar5->super_Constraint)->
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ;
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[](pvVar8,1);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                  ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff950);
        Vector3_t::operator=
                  ((Vector3_t *)in_stack_fffffffffffff930,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        std::
        vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
        ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
                      *)(in_RDI + 0xf8),(ulong)local_50);
        peVar5 = std::
                 __shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x6d8649);
        pvVar8 = &Constraint::getBodyFrames(&peVar5->super_Constraint)->
                  super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ;
        std::
        vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
        ::operator[](pvVar8,1);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator-
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                   CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),
                   (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff950);
        Matrix3_t::operator=
                  ((Matrix3_t *)in_stack_fffffffffffff930,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
        local_17c = 0;
        while( true ) {
          uVar9 = (ulong)local_17c;
          IVar10 = Eigen::EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::size
                             ((EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                              in_stack_fffffffffffff930);
          enableBaumgarteStabilization_00 = (undefined1)((ulong)in_stack_fffffffffffff9b8 >> 0x38);
          uVar2 = (uint)in_stack_fffffffffffffa00;
          if (IVar10 <= (long)uVar9) break;
          pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                               in_stack_fffffffffffff930,
                               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          if ((local_48 < ABS(*pSVar11)) ||
             (pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                                  ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                                   in_stack_fffffffffffff930,
                                   CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928)),
             local_48 < ABS(*pSVar11))) {
            local_51 = 0;
          }
          for (local_180 = 0; uVar9 = (ulong)local_180,
              IVar12 = Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols
                                 ((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)0x6d8761
                                 ), (long)uVar9 < IVar12; local_180 = local_180 + 1) {
            pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                                 in_stack_fffffffffffff930,
                                 CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                 0x6d8794);
            if ((local_48 < ABS(*pSVar13)) ||
               (pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                                     in_stack_fffffffffffff930,
                                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                                     0x6d87cd), local_48 < ABS(*pSVar13))) {
              local_51 = 0;
            }
          }
          local_17c = local_17c + 1;
        }
        if ((local_51 & 1) != 0) {
          std::
          vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
          ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
                        *)(in_RDI + 0xf8),(ulong)local_50);
          peVar5 = std::
                   __shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x6d884e);
          uVar1 = Constraint::getUserDefinedId(&peVar5->super_Constraint);
          if (uVar1 == in_stack_00000018) {
            local_49 = 1;
            std::
            vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
            ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
                          *)(in_RDI + 0xf8),(ulong)local_50);
            std::
            __shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x6d888c);
            LoopConstraint::appendConstraintAxis
                      ((LoopConstraint *)
                       CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                       (SpatialVector *)
                       CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                       SUB81((ulong)in_stack_fffffffffffff930 >> 0x38,0),
                       SUB81((ulong)in_stack_fffffffffffff930 >> 0x30,0));
          }
        }
      }
    }
  }
  if ((local_49 & 1) == 0) {
    in_stack_fffffffffffff928 = local_29 & 1;
    in_stack_fffffffffffff948 = 1;
    in_stack_fffffffffffff940 = 1;
    in_stack_fffffffffffff930 = in_stack_00000010;
    in_stack_fffffffffffff938 = in_stack_00000018;
    LoopConstraint::LoopConstraint
              (in_stack_fffffffffffff9e0,(uint)((ulong)in_stack_fffffffffffff9d8 >> 0x20),
               (uint)in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
               in_stack_fffffffffffff9c0,(bool)enableBaumgarteStabilization_00,
               in_stack_fffffffffffff9b0,in_stack_fffffffffffff9f8,uVar2,
               (bool)in_stack_fffffffffffff9af,(bool)in_stack_fffffffffffff9ae);
    std::make_shared<RigidBodyDynamics::LoopConstraint,RigidBodyDynamics::LoopConstraint&>
              ((LoopConstraint *)CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
    std::
    vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
    ::push_back((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
                 *)in_stack_fffffffffffff930,
                (value_type *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
    std::shared_ptr<RigidBodyDynamics::LoopConstraint>::~shared_ptr
              ((shared_ptr<RigidBodyDynamics::LoopConstraint> *)0x6d8987);
    sVar4 = std::
            vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
            ::size((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
                    *)(in_RDI + 0xf8));
    local_50 = (int)sVar4 - 1;
    std::
    vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
    ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
                  *)(in_RDI + 0xf8),(ulong)local_50);
    peVar5 = std::
             __shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<RigidBodyDynamics::LoopConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x6d89ca);
    Constraint::addToConstraintSet(&peVar5->super_Constraint,local_3c);
    std::
    vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
    ::operator[]((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>_>_>
                  *)(in_RDI + 0xf8),(ulong)local_50);
    std::
    vector<std::shared_ptr<RigidBodyDynamics::Constraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>>>
    ::emplace_back<std::shared_ptr<RigidBodyDynamics::LoopConstraint>&>
              ((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
               (shared_ptr<RigidBodyDynamics::LoopConstraint> *)
               CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    LoopConstraint::~LoopConstraint(in_stack_fffffffffffff930);
  }
  local_2a8 = 1;
  std::vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>
  ::push_back((vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>
               *)in_stack_fffffffffffff930,
              (value_type *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  std::__cxx11::string::string(local_2c8);
  if (in_stack_00000010 != (LoopConstraint *)0x0) {
    std::__cxx11::string::operator=(local_2c8,(char *)in_stack_00000010);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
              (value_type *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff930,
             CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       in_stack_fffffffffffff930,
                       CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  *pSVar14 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff930,
             CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       in_stack_fffffffffffff930,
                       CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  *pSVar14 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff930,
             CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       in_stack_fffffffffffff930,
                       CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  *pSVar14 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff930,
             CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       in_stack_fffffffffffff930,
                       CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  *pSVar14 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff930,
             CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                       in_stack_fffffffffffff930,
                       CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  *pSVar14 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Vector3_t *)in_stack_fffffffffffff930,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  std::allocator<Vector3_t>::allocator((allocator<Vector3_t> *)0x6d8cef);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)in_stack_fffffffffffff950,
             CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
             (value_type *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
             (allocator_type *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator=
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)
             CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
             (vector<Vector3_t,_std::allocator<Vector3_t>_> *)
             CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::~vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)
             CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
  std::allocator<Vector3_t>::~allocator((allocator<Vector3_t> *)0x6d8d4c);
  lVar15 = std::__cxx11::string::size();
  if (lVar15 != 0) {
    std::
    pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
    ::
    pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool,_true>
              ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
                *)in_stack_fffffffffffff930);
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(in_RDI + 0x20);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](this_00,sVar4 - 1);
    sVar4 = std::
            vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
            ::size((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                    *)(in_RDI + 200));
    local_35c = (int)sVar4 + -1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
               (uint *)in_stack_fffffffffffff930);
    _Var18 = std::
             map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
             ::insert<std::pair<std::__cxx11::string,unsigned_int>>
                       ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                        (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    local_370 = (_Base_ptr)_Var18.first._M_node;
    local_368 = _Var18.second;
    local_330.first._M_node = local_370;
    local_330.second = (bool)local_368;
    std::
    pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
    ::operator=(local_320,&local_330);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)0x6d8e75);
  }
  uVar2 = std::numeric_limits<unsigned_int>::max();
  if (in_stack_00000018 < uVar2) {
    std::pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool>::
    pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool,_true>
              ((pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> *)
               in_stack_fffffffffffff930);
    sVar4 = std::
            vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
            ::size((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                    *)(in_RDI + 200));
    local_39c = (int)sVar4 - 1;
    std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int,_true>
              (&local_398,&stack0x00000018,&local_39c);
    _Var19 = std::
             map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
             ::insert<std::pair<unsigned_int,unsigned_int>>
                       ((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                        (pair<unsigned_int,_unsigned_int> *)
                        CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    local_3b0 = (_Base_ptr)_Var19.first._M_node;
    local_3a8 = _Var19.second;
    local_390.first._M_node = local_3b0;
    local_390.second = (bool)local_3a8;
    std::pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool>::operator=
              (&local_380,&local_390);
  }
  std::pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool>::
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool,_true>
            ((pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> *)
             in_stack_fffffffffffff930);
  local_3dc = local_40 - 1;
  sVar4 = std::
          vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
          ::size((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,_std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>_>_>
                  *)(in_RDI + 200));
  local_3e0 = (int)sVar4 - 1;
  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
            (&local_3d8,&local_3dc,&local_3e0);
  _Var19 = std::
           map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
           ::insert<std::pair<unsigned_int,unsigned_int>>
                     ((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                      (pair<unsigned_int,_unsigned_int> *)
                      CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
  local_3f0 = (_Base_ptr)_Var19.first._M_node;
  local_3e8 = _Var19.second;
  local_3d0.first._M_node = local_3f0;
  local_3d0.second = (bool)local_3e8;
  std::pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool>::operator=
            (&local_3c0,&local_3d0);
  if ((local_3c0.second & 1U) != 0) {
    uVar2 = local_40 - 1;
    std::__cxx11::string::~string(local_2c8);
    return uVar2;
  }
  std::__cxx11::stringstream::stringstream(local_578);
  poVar16 = std::operator<<(local_568,"Error: Constraint row entry in system is not unique.");
  poVar16 = std::operator<<(poVar16,
                            " (This should not be possible: contact the maintainer of this code.)");
  std::ostream::operator<<(poVar16,std::endl<char,std::char_traits<char>>);
  uVar17 = __cxa_allocate_exception(0x28);
  std::__cxx11::stringstream::str();
  Errors::RBDLError::RBDLError
            ((RBDLError *)in_stack_fffffffffffff950,
             (string *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
  __cxa_throw(uVar17,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

unsigned int ConstraintSet::AddLoopConstraint (
  unsigned int idPredecessor,
  unsigned int idSuccessor,
  const Math::SpatialTransform &XPredecessor,
  const Math::SpatialTransform &XSuccessor,
  const Math::SpatialVector &constraintAxisInPredecessor,
  bool enableBaumgarteStabilization,
  double stabilizationTimeConstant,
  const char *constraintName,
  unsigned int userDefinedId)
{
  assert (bound == false);


  unsigned int insertAtRowInG = unsigned(size());
  unsigned int rowsInG = insertAtRowInG+1;

  double tol = std::numeric_limits<double>::epsilon()*100.;
  bool constraintAppended = false;
  unsigned int idx = unsigned(loopConstraints.size());

  if(loopConstraints.size() > 0) {
    idx = idx-1;
    if(loopConstraints[idx]->getBodyIds()[0] == idPredecessor &&
        loopConstraints[idx]->getBodyIds()[1] == idSuccessor) {

      bool framesNumericallyIdentical=true;
      SpatialTransform frameErrorPre, frameErrorSuc;

      frameErrorPre.r=XPredecessor.r-loopConstraints[idx]->getBodyFrames()[0].r;
      frameErrorPre.E=XPredecessor.E-loopConstraints[idx]->getBodyFrames()[0].E;

      frameErrorSuc.r=XSuccessor.r  -loopConstraints[idx]->getBodyFrames()[1].r;
      frameErrorSuc.E=XSuccessor.E  -loopConstraints[idx]->getBodyFrames()[1].E;

      //Using this awkward element by element comparison to maintain
      //compatibility with SimpleMath.
#ifndef RBDL_USE_CASADI_MATH
      for(unsigned int i=0; i<frameErrorPre.r.size(); ++i) {
        if(fabs(frameErrorPre.r[i]) > tol || fabs(frameErrorSuc.r[i]) > tol) {
          framesNumericallyIdentical=false;
        }
        for(unsigned int j=0; j<frameErrorPre.E.cols(); ++j) {
          if(fabs(frameErrorPre.E(i,j))>tol || fabs(frameErrorSuc.E(i,j))>tol) {
            framesNumericallyIdentical=false;
          }
        }
      }
#endif

      if(framesNumericallyIdentical
         && loopConstraints[idx]->getUserDefinedId() == userDefinedId) {
        constraintAppended = true;
        loopConstraints[idx]->appendConstraintAxis(constraintAxisInPredecessor);
      }
    }
  }

  if(constraintAppended==false) {

    LoopConstraint loopCon( idPredecessor, idSuccessor,
                            XPredecessor,  XSuccessor,
                            constraintAxisInPredecessor,
                            enableBaumgarteStabilization,
                            stabilizationTimeConstant,
                            constraintName,
                            userDefinedId);

    loopConstraints.push_back(std::make_shared<LoopConstraint>(loopCon));
    idx = unsigned(loopConstraints.size()-1);
    loopConstraints[idx]->addToConstraintSet(insertAtRowInG);
    constraints.emplace_back(loopConstraints[idx]);
  }

  constraintType.push_back(ConstraintTypeLoop);

  //Update all of the struct arrays so that they have the correct number
  //of elements
  std::string nameStr;
  if (constraintName != NULL) {
    nameStr = constraintName;
  }

  name.push_back (nameStr);


  err.conservativeResize(rowsInG);
  err[insertAtRowInG] = 0.;
  errd.conservativeResize(rowsInG);
  errd[insertAtRowInG] = 0.;

  force.conservativeResize (rowsInG);
  force[insertAtRowInG] = 0.;

  impulse.conservativeResize (rowsInG);
  impulse[insertAtRowInG] = 0.;

  v_plus.conservativeResize (rowsInG);
  v_plus[insertAtRowInG] = 0.;

  d_multdof3_u = std::vector<Math::Vector3d>(rowsInG, Math::Vector3d::Zero());

  //Set up access maps
  if(nameStr.size() > 0) {
    std::pair< std::map<std::string, unsigned int>::iterator, bool > iter;
    iter = nameGroupMap.insert(std::pair<std::string, unsigned int>(
                                 name[name.size()-1],
                                 unsigned(constraints.size()-1)));
    //if(iter.second == false){
    //  std::cerr << "Error: optional name is not unique."
    //            << std::endl;
    //  assert(0);
    //  abort();
    //}

  }

  if(userDefinedId < std::numeric_limits<unsigned int>::max()) {
    std::pair< std::map<unsigned int, unsigned int>::iterator, bool > iter;
    iter =userDefinedIdGroupMap.insert( std::pair<unsigned int, unsigned int>(
                                          userDefinedId,
                                          unsigned(constraints.size()-1)));
    //if(iter.second == false){
    //  std::cerr << "Error: optional userDefinedId is not unique."
    //            << std::endl;
    //  assert(0);
    //  abort();
    //}
  }

  std::pair< std::map<unsigned int, unsigned int>::iterator, bool > iter;
  iter = idGroupMap.insert(std::pair<unsigned int, unsigned int>(
                             unsigned(rowsInG-1),
                             unsigned(constraints.size()-1)));
  if(iter.second == false) {
    std::stringstream errormsg;
    errormsg << "Error: Constraint row entry in system is not unique."
             << " (This should not be possible: contact the "
             "maintainer of this code.)"
             << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  return rowsInG-1;
}